

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

byte Z80::GetByteNoMem(char **p,bool signedCheck)

{
  char *badValueMessage;
  int iVar1;
  char *oldP;
  aint val;
  bool signedCheck_local;
  char **p_local;
  
  oldP._7_1_ = signedCheck;
  _val = p;
  if ((int)DAT_001e16a8 == 0) {
    p_local._7_1_ = GetByte(p,signedCheck);
  }
  else {
    badValueMessage = *p;
    iVar1 = ParseExpressionMemAccess(p,(aint *)&oldP);
    if (iVar1 == 1) {
      if ((oldP._7_1_ & 1) == 0) {
        check8((aint)oldP);
      }
      else {
        check8o((aint)oldP);
      }
      p_local._7_1_ = (byte)oldP;
    }
    else if (iVar1 == 2) {
      Error("Illegal instruction (can\'t access memory)",badValueMessage,PASS3);
      p_local._7_1_ = '\0';
    }
    else {
      Error("Operand expected",badValueMessage,IF_FIRST);
      p_local._7_1_ = '\0';
    }
  }
  return p_local._7_1_;
}

Assistant:

static byte GetByteNoMem(char*& p, bool signedCheck = false) {
		if (0 == Options::syx.MemoryBrackets) return GetByte(p, signedCheck); // legacy behaviour => don't care
		aint val; char* const oldP = p;
		switch (ParseExpressionMemAccess(p, val)) {
		case 1:					// valid constant (not a memory access) => return value
			if (signedCheck) check8o(val);
			else check8(val);
			return val & 255;
		case 2:					// valid memory access => report error
			Error("Illegal instruction (can't access memory)", oldP);
			return 0;
		default:				// parsing failed, report syntax error
			Error("Operand expected", oldP, IF_FIRST);
			return 0;
		}
	}